

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O0

Box * __thiscall amrex::Box::refine(Box *this,int ref_ratio)

{
  uint uVar1;
  int in_ESI;
  Box *in_RDI;
  IntVect shft;
  bool local_1c9;
  IntVect local_1c8 [3];
  int iStack_19c;
  int local_198;
  IntVect local_194;
  IntVect *local_188;
  undefined4 local_134;
  IntVect *local_130;
  IndexType *local_118;
  IntVect local_10c [22];
  
  IntVect::IntVect(local_1c8,in_ESI);
  local_188 = local_1c8;
  local_134 = 1;
  local_1c9 = true;
  if ((local_1c8[0].vect[0] == 1) && (local_1c9 = true, local_1c8[0].vect[1] == 1)) {
    local_1c9 = local_1c8[0].vect[2] != 1;
  }
  if (local_1c9) {
    local_130 = local_188;
    IntVect::IntVect(&local_194,1);
    local_118 = &in_RDI->btype;
    uVar1 = local_118->itype;
    IntVect::IntVect(local_10c,uVar1 & 1,uVar1 >> 1 & 1,uVar1 >> 2 & 1);
    local_194.vect[0] = local_194.vect[0] - local_10c[0].vect[0];
    local_194.vect[1] = local_194.vect[1] - iStack_19c;
    local_194.vect[2] = local_194.vect[2] - local_198;
    (in_RDI->smallend).vect[0] = local_188->vect[0] * (in_RDI->smallend).vect[0];
    (in_RDI->smallend).vect[1] = local_188->vect[1] * (in_RDI->smallend).vect[1];
    (in_RDI->smallend).vect[2] = local_188->vect[2] * (in_RDI->smallend).vect[2];
    (in_RDI->bigend).vect[0] = local_194.vect[0] + (in_RDI->bigend).vect[0];
    (in_RDI->bigend).vect[1] = local_194.vect[1] + (in_RDI->bigend).vect[1];
    (in_RDI->bigend).vect[2] = local_194.vect[2] + (in_RDI->bigend).vect[2];
    (in_RDI->bigend).vect[0] = local_188->vect[0] * (in_RDI->bigend).vect[0];
    (in_RDI->bigend).vect[1] = local_188->vect[1] * (in_RDI->bigend).vect[1];
    (in_RDI->bigend).vect[2] = local_188->vect[2] * (in_RDI->bigend).vect[2];
    (in_RDI->bigend).vect[0] = (in_RDI->bigend).vect[0] - local_194.vect[0];
    (in_RDI->bigend).vect[1] = (in_RDI->bigend).vect[1] - local_194.vect[1];
    (in_RDI->bigend).vect[2] = (in_RDI->bigend).vect[2] - local_194.vect[2];
  }
  return in_RDI;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    Box& refine (int ref_ratio) noexcept {
        return this->refine(IntVect(ref_ratio));
    }